

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O1

void ggml_opt_dataset_shuffle(ggml_opt_context_t opt_ctx,ggml_opt_dataset_t dataset,int64_t idata)

{
  char *pcVar1;
  int line;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __last;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __first;
  
  if (dataset->ndata < idata) {
    pcVar1 = "idata <= dataset->ndata";
    line = 0x83;
LAB_00129339:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-opt.cpp"
               ,line,"GGML_ASSERT(%s) failed",pcVar1);
  }
  if (idata < 0) {
    __first._M_current =
         (dataset->permutation).super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (dataset->permutation).super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    if (idata % dataset->ndata_shard != 0) {
      pcVar1 = "idata % dataset->ndata_shard == 0";
      line = 0x8a;
      goto LAB_00129339;
    }
    __first._M_current =
         (dataset->permutation).super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current = __first._M_current + idata / dataset->ndata_shard;
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            (__first,__last,&opt_ctx->rng);
  return;
}

Assistant:

void ggml_opt_dataset_shuffle(ggml_opt_context_t opt_ctx, ggml_opt_dataset_t dataset, int64_t idata) {
    GGML_ASSERT(idata <= dataset->ndata);

    if (idata < 0) {
        std::shuffle(dataset->permutation.begin(), dataset->permutation.end(), opt_ctx->rng);
        return;
    }

    GGML_ASSERT(idata % dataset->ndata_shard == 0);
    const int64_t ishard_max = idata / dataset->ndata_shard;
    std::shuffle(dataset->permutation.begin(), dataset->permutation.begin() + ishard_max, opt_ctx->rng);
}